

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

BOOL __thiscall
Js::TypedArrayBase::SetAttributes
          (TypedArrayBase *this,PropertyId propertyId,PropertyAttributes attributes)

{
  BOOL BVar1;
  uint32 local_24 [2];
  uint32 index;
  
  BVar1 = ScriptContext::IsNumericPropertyId
                    ((((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                         super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,propertyId,local_24);
  if (BVar1 == 0) {
    BVar1 = DynamicObject::SetAttributes((DynamicObject *)this,propertyId,attributes);
  }
  else {
    ArrayObject::VerifySetItemAttributes((ArrayObject *)this,propertyId,attributes);
    BVar1 = 1;
  }
  return BVar1;
}

Assistant:

BOOL TypedArrayBase::SetAttributes(PropertyId propertyId, PropertyAttributes attributes)
    {
        ScriptContext* scriptContext = this->GetScriptContext();
        uint32 index;

        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            VerifySetItemAttributes(propertyId, attributes);
            return true;
        }

        return __super::SetAttributes(propertyId, attributes);
    }